

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  unsigned_short *puVar5;
  uint *puVar6;
  uint local_8c;
  uint local_88;
  uint k;
  uint local_80;
  uint end;
  uint start;
  ushort j_1;
  ushort *validInteriorPointers;
  ulong uStack_68;
  ushort pageIndex;
  uintptr_t objectAddress;
  ushort *puStack_58;
  ushort j;
  BlockInfoMapRow *blockInfoRow;
  uint local_48;
  uint maxObjectCountForBucket;
  uint stride;
  uint bucketSize;
  SmallHeapBlockBitVector *invalidBitVector;
  ushort *validPointers;
  ushort *puStack_28;
  uint i;
  ushort *buffer;
  BlockInfoMapTable *blockInfoTable_local;
  InvalidBitsTable *invalidTable_local;
  ValidPointersMapTable *validTable_local;
  
  puStack_28 = (ushort *)validTable;
  buffer = (ushort *)blockInfoTable;
  blockInfoTable_local = (BlockInfoMapTable *)invalidTable;
  invalidTable_local = (InvalidBitsTable *)validTable;
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0xc000);
  }
  validPointers._4_4_ = 0;
  do {
    if (0x2f < validPointers._4_4_) {
      return;
    }
    invalidBitVector = (SmallHeapBlockBitVector *)puStack_28;
    if (puStack_28 != (ushort *)0x0) {
      puStack_28 = puStack_28 + 0x100;
    }
    _stride = *blockInfoTable_local + (ulong)validPointers._4_4_ * 8;
    BVStatic<256UL>::SetAll((BVStatic<256UL> *)_stride);
    maxObjectCountForBucket = validPointers._4_4_ * 0x10 + 0x10;
    local_48 = maxObjectCountForBucket >> 4;
    blockInfoRow._4_4_ =
         SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(maxObjectCountForBucket),0);
    puStack_58 = buffer + (ulong)validPointers._4_4_ * 2;
    memset(puStack_58,0,4);
    for (objectAddress._6_2_ = 0; objectAddress._6_2_ < blockInfoRow._4_4_;
        objectAddress._6_2_ = objectAddress._6_2_ + 1) {
      if (invalidBitVector != (SmallHeapBlockBitVector *)0x0) {
        *(ushort *)
         ((long)&invalidBitVector->data[0].word + (ulong)(objectAddress._6_2_ * local_48) * 2) =
             objectAddress._6_2_;
      }
      uStack_68 = (ulong)(objectAddress._6_2_ * maxObjectCountForBucket);
      if (0xfffe < objectAddress._6_2_ * maxObjectCountForBucket >> 0xc) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                           ,0xaa,"(objectAddress / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                           "objectAddress / AutoSystemInfo::PageSize < USHRT_MAX");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      uVar4 = uStack_68 >> 0xc;
      validInteriorPointers._6_2_ = (ushort)uVar4;
      puStack_58[(uVar4 & 0xffff) * 2 + 1] = puStack_58[(uVar4 & 0xffff) * 2 + 1] + 1;
      puVar5 = max<unsigned_short>((unsigned_short *)((long)&objectAddress + 6),
                                   puStack_58 + (uVar4 & 0xffff) * 2);
      puStack_58[(ulong)validInteriorPointers._6_2_ * 2] = *puVar5;
      BVStatic<256UL>::Clear((BVStatic<256UL> *)_stride,objectAddress._6_2_ * local_48);
    }
    if (puStack_28 != (ushort *)0x0) {
      _start = puStack_28;
      puStack_28 = puStack_28 + 0x100;
      for (end._2_2_ = 0; end._2_2_ < blockInfoRow._4_4_; end._2_2_ = end._2_2_ + 1) {
        local_80 = end._2_2_ * local_48;
        local_88 = local_80 + local_48;
        puVar6 = min<unsigned_int>(&local_88,&SmallAllocationBlockAttributes::MaxSmallObjectCount);
        k = *puVar6;
        for (local_8c = local_80; local_8c < k; local_8c = local_8c + 1) {
          _start[local_8c] = end._2_2_;
        }
      }
    }
    validPointers._4_4_ = validPointers._4_4_ + 1;
  } while( true );
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}